

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort *puVar9;
  ushort *puVar10;
  ushort *__src;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  BYTE *d;
  char *pcVar14;
  char *__dest;
  long lVar15;
  ulong uVar16;
  BYTE *s;
  int local_68;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar13 = -1;
  if (-1 < dstCapacity && src != (char *)0x0) {
    if (dstCapacity == 0) {
      iVar13 = 0;
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(src + compressedSize);
      pcVar2 = dst + (uint)dstCapacity;
      __dest = dst;
      puVar10 = (ushort *)src;
LAB_0011a76a:
      do {
        __src = (ushort *)((long)puVar10 + 1);
        bVar3 = (byte)*puVar10;
        uVar16 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          if (pbVar1 + -0xf <= __src) goto LAB_0011aa69;
          puVar10 = puVar10 + 1;
          lVar15 = 0;
          puVar9 = __src;
          do {
            __src = (ushort *)((long)puVar9 + 1);
            if (pbVar1 + -0xf < __src) goto LAB_0011aa69;
            uVar7 = *puVar9;
            lVar15 = lVar15 + (ulong)(byte)uVar7;
            puVar10 = (ushort *)((long)puVar10 + 1);
            puVar9 = __src;
          } while ((ulong)(byte)uVar7 == 0xff);
          if (((lVar15 == -1) || (uVar16 = lVar15 + 0xf, CARRY8((ulong)__dest,uVar16))) ||
             ((ulong)-(long)puVar10 < uVar16)) goto LAB_0011aa69;
LAB_0011a7de:
          pcVar14 = __dest + uVar16;
          if ((pcVar2 + -0xc < pcVar14) ||
             (puVar10 = (ushort *)((long)__src + uVar16), pbVar1 + -8 < puVar10)) {
            pcVar12 = pcVar14;
            if (pbVar1 < (byte *)((long)__src + uVar16)) {
              pcVar12 = __dest + ((long)pbVar1 - (long)__src);
            }
            if (pcVar2 < pcVar12) {
              memmove(__dest,__src,(long)pcVar2 - (long)__dest);
              pcVar14 = pcVar2;
              break;
            }
            if (pbVar1 < (byte *)((long)__src + uVar16)) {
              uVar16 = (long)pbVar1 - (long)__src;
            }
            memmove(__dest,__src,uVar16);
            pcVar14 = __dest + uVar16;
            if ((pcVar12 == pcVar2) ||
               (puVar10 = (ushort *)((long)__src + uVar16), pbVar1 + -2 <= puVar10)) break;
          }
          else {
            do {
              *(undefined8 *)__dest = *(undefined8 *)__src;
              __dest = __dest + 8;
              __src = __src + 4;
            } while (__dest < pcVar14);
          }
          uVar7 = *puVar10;
          __src = puVar10 + 1;
          pcVar12 = pcVar14 + -(ulong)uVar7;
          uVar11 = (ulong)(bVar3 & 0xf);
        }
        else {
          if ((src + (long)compressedSize + -0x10 <= __src) ||
             (dst + ((ulong)(uint)dstCapacity - 0x20) < __dest)) goto LAB_0011a7de;
          uVar6 = *(undefined8 *)((long)puVar10 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar6;
          pcVar14 = __dest + uVar16;
          uVar11 = (ulong)(bVar3 & 0xf);
          puVar10 = (ushort *)((long)__src + uVar16);
          __src = puVar10 + 1;
          uVar7 = *puVar10;
          pcVar12 = pcVar14 + -(ulong)uVar7;
          if (((uVar11 != 0xf) && (7 < uVar7)) && (dst <= pcVar12)) {
            *(undefined8 *)pcVar14 = *(undefined8 *)pcVar12;
            *(undefined8 *)(pcVar14 + 8) = *(undefined8 *)(pcVar12 + 8);
            *(undefined2 *)(pcVar14 + 0x10) = *(undefined2 *)(pcVar12 + 0x10);
            __dest = pcVar14 + uVar11 + 4;
            puVar10 = __src;
            goto LAB_0011a76a;
          }
        }
        if ((int)uVar11 == 0xf) {
          lVar15 = 0;
          puVar10 = __src;
          do {
            __src = (ushort *)((long)puVar10 + 1);
            if (pbVar1 + -4 < __src) goto LAB_0011aa69;
            uVar8 = *puVar10;
            lVar15 = lVar15 + (ulong)(byte)uVar8;
            puVar10 = __src;
          } while ((ulong)(byte)uVar8 == 0xff);
          uVar11 = lVar15 + 0xf;
          if ((lVar15 == -1) || (CARRY8((ulong)pcVar14,uVar11))) goto LAB_0011aa69;
        }
        if (pcVar12 < dst) {
LAB_0011aa69:
          local_68 = (int)src;
          return ~(uint)__src + local_68;
        }
        uVar11 = uVar11 + 4;
        __dest = pcVar14 + uVar11;
        puVar10 = __src;
        if (__dest <= pcVar2 + -0xc) {
          if (uVar7 < 8) {
            pcVar14[0] = '\0';
            pcVar14[1] = '\0';
            pcVar14[2] = '\0';
            pcVar14[3] = '\0';
            *pcVar14 = *pcVar12;
            pcVar14[1] = pcVar12[1];
            pcVar14[2] = pcVar12[2];
            pcVar14[3] = pcVar12[3];
            uVar5 = inc32table[uVar7];
            *(undefined4 *)(pcVar14 + 4) = *(undefined4 *)(pcVar12 + uVar5);
            pcVar12 = pcVar12 + ((ulong)uVar5 - (long)dec64table[uVar7]);
          }
          else {
            *(undefined8 *)pcVar14 = *(undefined8 *)pcVar12;
            pcVar12 = pcVar12 + 8;
          }
          *(undefined8 *)(pcVar14 + 8) = *(undefined8 *)pcVar12;
          if (0x10 < uVar11) {
            pcVar14 = pcVar14 + 0x10;
            do {
              pcVar12 = pcVar12 + 8;
              *(undefined8 *)pcVar14 = *(undefined8 *)pcVar12;
              pcVar14 = pcVar14 + 8;
            } while (pcVar14 < __dest);
          }
          goto LAB_0011a76a;
        }
        uVar16 = (long)pcVar2 - (long)pcVar14;
        if (uVar11 < (ulong)((long)pcVar2 - (long)pcVar14)) {
          uVar16 = uVar11;
        }
        __dest = pcVar14 + uVar16;
        if (pcVar14 < pcVar12 + uVar16) {
          if (0 < (long)uVar16) {
            do {
              cVar4 = *pcVar12;
              pcVar12 = pcVar12 + 1;
              *pcVar14 = cVar4;
              pcVar14 = pcVar14 + 1;
            } while (pcVar14 < __dest);
          }
        }
        else {
          memcpy(pcVar14,pcVar12,uVar16);
        }
        pcVar14 = pcVar2;
      } while (__dest != pcVar2);
      iVar13 = (int)pcVar14 - (int)dst;
    }
  }
  return iVar13;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}